

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O2

int X509_NAME_get_index_by_OBJ(X509_NAME *name,ASN1_OBJECT *obj,int lastpos)

{
  OPENSSL_STACK *sk;
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  size_t i;
  
  if (name == (X509_NAME *)0x0) {
    lastpos = -1;
  }
  else {
    sk = (OPENSSL_STACK *)name->entries;
    sVar2 = OPENSSL_sk_num(sk);
    if (lastpos < 0) {
      lastpos = -1;
    }
    i = (size_t)lastpos;
    do {
      i = i + 1;
      if ((long)(int)sVar2 <= (long)i) {
        return -1;
      }
      puVar3 = (undefined8 *)OPENSSL_sk_value(sk,i);
      iVar1 = OBJ_cmp((ASN1_OBJECT *)*puVar3,obj);
      lastpos = lastpos + 1;
    } while (iVar1 != 0);
  }
  return lastpos;
}

Assistant:

int X509_NAME_get_index_by_OBJ(const X509_NAME *name, const ASN1_OBJECT *obj,
                               int lastpos) {
  if (name == NULL) {
    return -1;
  }
  if (lastpos < 0) {
    lastpos = -1;
  }
  const STACK_OF(X509_NAME_ENTRY) *sk = name->entries;
  int n = (int)sk_X509_NAME_ENTRY_num(sk);
  for (lastpos++; lastpos < n; lastpos++) {
    const X509_NAME_ENTRY *ne = sk_X509_NAME_ENTRY_value(sk, lastpos);
    if (OBJ_cmp(ne->object, obj) == 0) {
      return lastpos;
    }
  }
  return -1;
}